

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_scheduler.c
# Opt level: O0

int mk_sched_threads_destroy_conn(mk_sched_worker *sched,mk_sched_conn *conn)

{
  mk_list *__mptr;
  mk_http_thread *mth;
  mk_list *head;
  mk_list *tmp;
  int c;
  mk_sched_conn *conn_local;
  mk_sched_worker *sched_local;
  
  tmp._4_4_ = 0;
  mth = (mk_http_thread *)(sched->threads).next;
  head = (mk_list *)mth->session;
  while (mth != (mk_http_thread *)&sched->threads) {
    if ((mk_sched_conn *)(mth[-1].parent)->cb_destroy == conn) {
      mk_http_thread_destroy((mk_http_thread *)&mth[-1].request);
      tmp._4_4_ = tmp._4_4_ + 1;
    }
    mth = (mk_http_thread *)head;
    head = head->next;
  }
  return tmp._4_4_;
}

Assistant:

int mk_sched_threads_destroy_conn(struct mk_sched_worker *sched,
                                  struct mk_sched_conn *conn)
{
    int c = 0;
    struct mk_list *tmp;
    struct mk_list *head;
    struct mk_http_thread *mth;
    (void) sched;

    mk_list_foreach_safe(head, tmp, &sched->threads) {
        mth = mk_list_entry(head, struct mk_http_thread, _head);
        if (mth->session->conn == conn) {
            mk_http_thread_destroy(mth);
            c++;
        }
    }
    return c;
}